

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckedint_impl.h
# Opt level: O3

bool QtPrivate::QEqualityOperatorForType<QRect,_true>::equals
               (QMetaTypeInterface *param_1,void *a,void *b)

{
  if (((*a == *b) && (*(int *)((long)a + 8) == *(int *)((long)b + 8))) &&
     (*(int *)((long)a + 4) == *(int *)((long)b + 4))) {
    return *(int *)((long)a + 0xc) == *(int *)((long)b + 0xc);
  }
  return false;
}

Assistant:

Q_DECLARE_STRONGLY_ORDERED_LITERAL_TYPE(
        QCheckedInt,
        AInt,
        template <typename AInt, if_is_same_int<AInt> = true>)
};

template <typename Int, typename I, typename P>
Q_DECL_CONST_FUNCTION size_t constexpr inline qHash(QCheckedInt<Int, I, P> key, size_t seed = 0) noexcept
{
    using QT_PREPEND_NAMESPACE(qHash);
    return qHash(key.value(), seed);
}